

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

int ps_decode_senscr(ps_decoder_t *ps,FILE *senfh)

{
  int iVar1;
  int local_28;
  int n_searchfr;
  int nfr;
  FILE *senfh_local;
  ps_decoder_t *ps_local;
  
  ps_start_utt(ps);
  local_28 = 0;
  acmod_set_insenfh(ps->acmod,senfh);
  while( true ) {
    iVar1 = acmod_read_scores(ps->acmod);
    if (iVar1 < 1) {
      ps_end_utt(ps);
      acmod_set_insenfh(ps->acmod,(FILE *)0x0);
      return local_28;
    }
    iVar1 = ps_search_forward(ps);
    if (iVar1 < 0) break;
    local_28 = iVar1 + local_28;
  }
  ps_end_utt(ps);
  return iVar1;
}

Assistant:

int
ps_decode_senscr(ps_decoder_t *ps, FILE *senfh)
{
    int nfr, n_searchfr;

    ps_start_utt(ps);
    n_searchfr = 0;
    acmod_set_insenfh(ps->acmod, senfh);
    while ((nfr = acmod_read_scores(ps->acmod)) > 0) {
        if ((nfr = ps_search_forward(ps)) < 0) {
            ps_end_utt(ps);
            return nfr;
        }
        n_searchfr += nfr;
    }
    ps_end_utt(ps);
    acmod_set_insenfh(ps->acmod, NULL);

    return n_searchfr;
}